

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetKotlinFactoryName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  ushort *puVar1;
  string_view field_name;
  bool bVar2;
  java *this_00;
  bool in_R8B;
  string_view input;
  string name;
  _Alloc_hider in_stack_ffffffffffffff70;
  AlphaNum *in_stack_ffffffffffffff78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  AlphaNum local_70;
  lts_20250127 local_40 [48];
  
  puVar1 = (ushort *)(descriptor->all_names_).payload_;
  this_00 = (java *)(ulong)*puVar1;
  input._M_len = (long)puVar1 + ~(ulong)this_00;
  input._M_str = (char *)0x1;
  ToCamelCase_abi_cxx11_((string *)&stack0xffffffffffffff70,this_00,input,in_R8B);
  field_name._M_str = (char *)in_stack_ffffffffffffff78;
  field_name._M_len = (size_t)in_stack_ffffffffffffff70._M_p;
  bVar2 = IsForbiddenKotlin(field_name);
  if (bVar2) {
    local_70.piece_._M_len = 1;
    local_70.piece_._M_str = "_";
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,local_40,&local_70,in_stack_ffffffffffffff78);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,in_stack_ffffffffffffff70._M_p,
               in_stack_ffffffffffffff70._M_p + (long)(in_stack_ffffffffffffff78->digits_ + -0x10));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff70._M_p != &local_80) {
    operator_delete(in_stack_ffffffffffffff70._M_p,local_80._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetKotlinFactoryName(
    const Descriptor* descriptor) {
  std::string name = ToCamelCase(descriptor->name(), /* lower_first = */ true);
  return IsForbiddenKotlin(name) ? absl::StrCat(name, "_") : name;
}